

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O3

int sqlite3ExprCodeGetColumn(Parse *pParse,Table *pTab,int iColumn,int iTable,int iReg,u8 p5)

{
  byte bVar1;
  int iVar2;
  Vdbe *v;
  long lVar3;
  
  v = pParse->pVdbe;
  bVar1 = pParse->nColCache;
  if (bVar1 != 0) {
    lVar3 = 0;
    do {
      if ((*(int *)((long)&pParse->aColCache[0].iTable + lVar3) == iTable) &&
         (*(short *)((long)&pParse->aColCache[0].iColumn + lVar3) == iColumn)) {
        iVar2 = pParse->iCacheCnt;
        pParse->iCacheCnt = iVar2 + 1;
        *(int *)((long)&pParse->aColCache[0].lru + lVar3) = iVar2;
        iVar2 = *(int *)((long)&pParse->aColCache[0].iReg + lVar3);
        lVar3 = 0;
        do {
          if (*(int *)((long)&pParse->aColCache[0].iReg + lVar3) == iVar2) {
            (&pParse->aColCache[0].tempReg)[lVar3] = '\0';
          }
          lVar3 = lVar3 + 0x14;
        } while ((uint)bVar1 * 0x14 != (int)lVar3);
        return iVar2;
      }
      lVar3 = lVar3 + 0x14;
    } while ((uint)bVar1 * 0x14 != (int)lVar3);
  }
  sqlite3ExprCodeGetColumnOfTable(v,pTab,iTable,iColumn,iReg);
  if (p5 == '\0') {
    sqlite3ExprCacheStore(pParse,iTable,iColumn,iReg);
  }
  else if (0 < (long)v->nOp) {
    v->aOp[(long)v->nOp + -1].p5 = (ushort)p5;
  }
  return iReg;
}

Assistant:

SQLITE_PRIVATE int sqlite3ExprCodeGetColumn(
  Parse *pParse,   /* Parsing and code generating context */
  Table *pTab,     /* Description of the table we are reading from */
  int iColumn,     /* Index of the table column */
  int iTable,      /* The cursor pointing to the table */
  int iReg,        /* Store results here */
  u8 p5            /* P5 value for OP_Column + FLAGS */
){
  Vdbe *v = pParse->pVdbe;
  int i;
  struct yColCache *p;

  for(i=0, p=pParse->aColCache; i<pParse->nColCache; i++, p++){
    if( p->iTable==iTable && p->iColumn==iColumn ){
      p->lru = pParse->iCacheCnt++;
      sqlite3ExprCachePinRegister(pParse, p->iReg);
      return p->iReg;
    }
  }  
  assert( v!=0 );
  sqlite3ExprCodeGetColumnOfTable(v, pTab, iTable, iColumn, iReg);
  if( p5 ){
    sqlite3VdbeChangeP5(v, p5);
  }else{   
    sqlite3ExprCacheStore(pParse, iTable, iColumn, iReg);
  }
  return iReg;
}